

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O0

void __thiscall flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,CallInstr *callInstr)

{
  bool bVar1;
  int iVar2;
  LiteralType LVar3;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *pvVar4;
  size_type sVar5;
  Value *value;
  IRBuiltinFunction *pIVar6;
  Signature *this_00;
  size_t sVar7;
  int local_20;
  bool returnsValue;
  int i;
  int argc;
  CallInstr *callInstr_local;
  TargetCodeGenerator *this_local;
  
  pvVar4 = Instr::operands(&callInstr->super_Instr);
  sVar5 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::size(pvVar4);
  iVar2 = (int)sVar5 + -1;
  for (local_20 = 1; local_20 <= iVar2; local_20 = local_20 + 1) {
    value = Instr::operand(&callInstr->super_Instr,(long)local_20);
    emitLoad(this,value);
  }
  pIVar6 = CallInstr::callee(callInstr);
  this_00 = IRBuiltinFunction::signature(pIVar6);
  LVar3 = Signature::returnType(this_00);
  pIVar6 = CallInstr::callee(callInstr);
  sVar7 = ConstantPool::makeNativeFunction(&this->cp_,pIVar6);
  pvVar4 = Instr::operands(&callInstr->super_Instr);
  sVar5 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::size(pvVar4);
  emitInstr(this,CALL,(Operand)sVar7,(short)sVar5 - 1,(ushort)(LVar3 != Void));
  if (iVar2 != 0) {
    pop(this,(long)iVar2);
  }
  if (LVar3 != Void) {
    push(this,(Value *)callInstr);
    bVar1 = Value::isUsed((Value *)callInstr);
    if (!bVar1) {
      emitInstr(this,DISCARD,1);
      pop(this,1);
    }
  }
  return;
}

Assistant:

void TargetCodeGenerator::visit(CallInstr& callInstr) {
  const int argc = callInstr.operands().size() - 1;
  for (int i = 1; i <= argc; ++i)
    emitLoad(callInstr.operand(i));

  const bool returnsValue =
      callInstr.callee()->signature().returnType() != LiteralType::Void;

  emitInstr(Opcode::CALL,
      cp_.makeNativeFunction(callInstr.callee()),
      callInstr.operands().size() - 1,
      returnsValue ? 1 : 0);

  if (argc)
    pop(argc);

  if (returnsValue) {
    push(&callInstr);

    if (!callInstr.isUsed()) {
      emitInstr(Opcode::DISCARD, 1);
      pop(1);
    }
  }
}